

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingReporter.cpp
# Opt level: O0

void __thiscall jaegertracing::reporters::LoggingReporter::report(LoggingReporter *this,Span *span)

{
  Logger *pLVar1;
  ostream *out;
  string local_1b0 [32];
  undefined1 local_190 [8];
  ostringstream oss;
  Span *span_local;
  LoggingReporter *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  out = std::operator<<((ostream *)local_190,"Reporting span ");
  ::operator<<(out,span);
  pLVar1 = this->_logger;
  std::__cxx11::ostringstream::str();
  (*pLVar1->_vptr_Logger[3])(pLVar1,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void LoggingReporter::report(const Span& span) noexcept
{
    std::ostringstream oss;
    oss << "Reporting span " << span;
    _logger.info(oss.str());
}